

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_wait_release.h
# Opt level: O0

uint __thiscall kmp_flag<unsigned_int>::load(kmp_flag<unsigned_int> *this)

{
  uint *puVar1;
  undefined8 *in_RDI;
  memory_order __b;
  
  puVar1 = (uint *)*in_RDI;
  std::operator&(memory_order_acquire,__memory_order_mask);
  return *puVar1;
}

Assistant:

P load() { return loc->load(std::memory_order_acquire); }